

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_GetVsizeFromSize_Test::TestBody(AbstractTransaction_GetVsizeFromSize_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_30.ss_.ptr_._0_4_ = 2;
  local_28.data_._0_4_ = cfd::core::AbstractTransaction::GetVsizeFromSize(1,4);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            (local_20,"2","AbstractTransaction::GetVsizeFromSize(1, 4)",(int *)&local_30,
             (uint *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x150,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(AbstractTransaction, GetVsizeFromSize) {
  EXPECT_EQ(2, AbstractTransaction::GetVsizeFromSize(1, 4));
}